

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprintf.c
# Opt level: O3

char * curl_mvaprintf(char *format,__va_list_tag *ap_save)

{
  size_t sVar1;
  char *pcVar2;
  asprintf info;
  dynbuf dyn;
  dynbuf *local_48;
  char local_40;
  dynbuf local_38;
  
  local_48 = &local_38;
  Curl_dyn_init(local_48,8000000);
  local_40 = '\0';
  formatf(&local_48,alloc_addbyter,format,ap_save);
  if (local_40 == '\0') {
    sVar1 = Curl_dyn_len(local_48);
    if (sVar1 == 0) {
      pcVar2 = (*Curl_cstrdup)("");
    }
    else {
      pcVar2 = Curl_dyn_ptr(local_48);
    }
  }
  else {
    Curl_dyn_free(local_48);
    pcVar2 = (char *)0x0;
  }
  return pcVar2;
}

Assistant:

char *curl_mvaprintf(const char *format, va_list ap_save)
{
  struct asprintf info;
  struct dynbuf dyn;
  info.b = &dyn;
  Curl_dyn_init(info.b, DYN_APRINTF);
  info.merr = MERR_OK;

  (void)formatf(&info, alloc_addbyter, format, ap_save);
  if(info.merr) {
    Curl_dyn_free(info.b);
    return NULL;
  }
  if(Curl_dyn_len(info.b))
    return Curl_dyn_ptr(info.b);
  return strdup("");
}